

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ahocorasick.c
# Opt level: O0

void ac_trie_traverse_setfailure(ACT_NODE_t *node,AC_ALPHABET_t *prefix)

{
  ACT_NODE_t *in_RSI;
  long in_RDI;
  size_t i;
  AC_ALPHABET_t *prefix_00;
  
  ac_trie_set_failure(node,prefix);
  for (prefix_00 = (AC_ALPHABET_t *)0x0; prefix_00 < *(AC_ALPHABET_t **)(in_RDI + 0x28);
      prefix_00 = prefix_00 + 1) {
    *(undefined1 *)((long)&in_RSI->id + *(long *)(in_RDI + 8)) =
         *(undefined1 *)(*(long *)(in_RDI + 0x18) + (long)prefix_00 * 0x10);
    ac_trie_traverse_setfailure(in_RSI,prefix_00);
  }
  return;
}

Assistant:

static void ac_trie_traverse_setfailure 
    (ACT_NODE_t *node, AC_ALPHABET_t *prefix)
{
    size_t i;
    
    /* In each node, look for its failure node */
    ac_trie_set_failure (node, prefix);
    
    for (i = 0; i < node->outgoing_size; i++)
    {
        prefix[node->depth] = node->outgoing[i].alpha; /* Make the prefix */
        
        /* Recursively call itself to traverse all nodes */
        ac_trie_traverse_setfailure (node->outgoing[i].next, prefix);
    }
}